

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

bool __thiscall leveldb::Compaction::IsBaseLevelForKey(Compaction *this,Slice *user_key)

{
  long lVar1;
  pointer ppFVar2;
  FileMetaData *pFVar3;
  bool bVar4;
  int iVar5;
  Comparator *pCVar6;
  long lVar7;
  pointer local_58;
  long local_50;
  Comparator *local_48;
  Slice *local_40;
  _Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *local_38;
  
  lVar7 = (long)this->level_;
  bVar4 = 4 < lVar7;
  if (lVar7 < 5) {
    pCVar6 = (this->input_version_->vset_->icmp_).user_comparator_;
    lVar7 = lVar7 + 2;
    local_48 = pCVar6;
    local_40 = user_key;
    do {
      local_38 = &this->input_version_->files_[lVar7].
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      ;
      do {
        ppFVar2 = (local_38->_M_impl).super__Vector_impl_data._M_start;
        if ((ulong)((long)(local_38->_M_impl).super__Vector_impl_data._M_finish - (long)ppFVar2 >> 3
                   ) <= this->level_ptrs_[lVar7]) goto LAB_0011993e;
        pFVar3 = ppFVar2[this->level_ptrs_[lVar7]];
        local_58 = (pFVar3->largest).rep_._M_dataplus._M_p;
        local_50 = (pFVar3->largest).rep_._M_string_length - 8;
        iVar5 = (*pCVar6->_vptr_Comparator[2])(pCVar6);
        if (iVar5 < 1) {
          local_58 = (pFVar3->smallest).rep_._M_dataplus._M_p;
          local_50 = (pFVar3->smallest).rep_._M_string_length - 8;
          iVar5 = (*pCVar6->_vptr_Comparator[2])(pCVar6,user_key,&local_58);
          iVar5 = (iVar5 >> 0x1f) * -5 + 1;
        }
        else {
          this->level_ptrs_[lVar7] = this->level_ptrs_[lVar7] + 1;
          iVar5 = 0;
        }
        pCVar6 = local_48;
        user_key = local_40;
      } while (iVar5 == 0);
      if (iVar5 != 6) {
        return bVar4;
      }
LAB_0011993e:
      lVar1 = lVar7 + 1;
      bVar4 = 5 < lVar7;
      lVar7 = lVar1;
    } while ((int)lVar1 != 7);
  }
  return bVar4;
}

Assistant:

bool Compaction::IsBaseLevelForKey(const Slice& user_key) {
  // Maybe use binary search to find right entry instead of linear search?
  const Comparator* user_cmp = input_version_->vset_->icmp_.user_comparator();
  for (int lvl = level_ + 2; lvl < config::kNumLevels; lvl++) {
    const std::vector<FileMetaData*>& files = input_version_->files_[lvl];
    while (level_ptrs_[lvl] < files.size()) {
      FileMetaData* f = files[level_ptrs_[lvl]];
      if (user_cmp->Compare(user_key, f->largest.user_key()) <= 0) {
        // We've advanced far enough
        if (user_cmp->Compare(user_key, f->smallest.user_key()) >= 0) {
          // Key falls in this file's range, so definitely not base level
          return false;
        }
        break;
      }
      level_ptrs_[lvl]++;
    }
  }
  return true;
}